

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deconvolution_x86_avx512.cpp
# Opt level: O1

int __thiscall
ncnn::Deconvolution_x86_avx512::create_pipeline(Deconvolution_x86_avx512 *this,Option *opt)

{
  uint uVar1;
  _func_int *p_Var2;
  _func_int **pp_Var3;
  int *piVar4;
  Layer *pLVar5;
  _func_int ***ppp_Var6;
  int k;
  ulong uVar7;
  undefined4 *puVar8;
  Option *pOVar9;
  int _w;
  ulong uVar10;
  ulong uVar11;
  undefined4 *puVar12;
  _func_int ***ppp_Var13;
  ulong uVar14;
  long lVar15;
  _func_int ***ppp_Var16;
  ulong uVar17;
  _func_int ***ppp_Var18;
  int _h;
  int iVar19;
  ulong uVar20;
  long lVar21;
  long lVar22;
  ParamDict pd;
  ParamDict pd_5;
  Mat local_138;
  ulong local_e8;
  ParamDict local_e0;
  ulong local_d0;
  Mat local_c8;
  ulong local_80;
  Allocator *local_78;
  ulong local_70;
  Option *local_68;
  long local_60;
  void *local_58;
  ulong local_50;
  _func_int **local_48;
  ModelBinFromMatArray local_40;
  
  p_Var2 = this->_vptr_Deconvolution_x86_avx512[-3];
  switch(*(undefined4 *)(&this->field_0x114 + (long)p_Var2)) {
  case 1:
    pLVar5 = create_layer(0x1a);
    ParamDict::ParamDict((ParamDict *)&local_138);
    (*pLVar5->_vptr_Layer[2])(pLVar5,&local_138);
    break;
  case 2:
    pLVar5 = create_layer(0x1a);
    ParamDict::ParamDict((ParamDict *)&local_138);
    ParamDict::set((ParamDict *)&local_138,0,**(float **)(&this->field_0x118 + (long)p_Var2));
    (*pLVar5->_vptr_Layer[2])(pLVar5,&local_138);
    break;
  case 3:
    pLVar5 = create_layer(0x36);
    ParamDict::ParamDict((ParamDict *)&local_138);
    ParamDict::set((ParamDict *)&local_138,0,**(float **)(&this->field_0x118 + (long)p_Var2));
    ParamDict::set((ParamDict *)&local_138,1,
                   *(float *)(*(long *)(&this->field_0x118 + (long)p_Var2) + 4));
    (*pLVar5->_vptr_Layer[2])(pLVar5,&local_138);
    break;
  case 4:
    pLVar5 = create_layer(0x1e);
    ParamDict::ParamDict((ParamDict *)&local_138);
    (*pLVar5->_vptr_Layer[2])(pLVar5,&local_138);
    break;
  case 5:
    pLVar5 = create_layer(0x47);
    ParamDict::ParamDict((ParamDict *)&local_138);
    (*pLVar5->_vptr_Layer[2])(pLVar5,&local_138);
    break;
  case 6:
    pLVar5 = create_layer(0x43);
    ParamDict::ParamDict((ParamDict *)&local_138);
    ParamDict::set((ParamDict *)&local_138,0,**(float **)(&this->field_0x118 + (long)p_Var2));
    ParamDict::set((ParamDict *)&local_138,1,
                   *(float *)(*(long *)(&this->field_0x118 + (long)p_Var2) + 4));
    (*pLVar5->_vptr_Layer[2])(pLVar5,&local_138);
    break;
  default:
    pLVar5 = (Layer *)0x0;
    goto LAB_0028a915;
  }
  ParamDict::~ParamDict((ParamDict *)&local_138);
LAB_0028a915:
  if (pLVar5 != (Layer *)0x0) {
    (*pLVar5->_vptr_Layer[4])(pLVar5,opt);
  }
  this->activation = pLVar5;
  p_Var2 = this->_vptr_Deconvolution_x86_avx512[-3];
  uVar10 = (long)*(int *)(&this->field_0xd8 + (long)p_Var2) *
           (long)*(int *)(&this->field_0xd4 + (long)p_Var2);
  uVar1 = *(uint *)(&this->field_0xd0 + (long)p_Var2);
  _w = (int)uVar10;
  uVar14 = (long)*(int *)(&this->field_0x110 + (long)p_Var2) / (long)_w;
  uVar14 = (long)((ulong)(uint)((int)uVar14 >> 0x1f) << 0x20 | uVar14 & 0xffffffff) /
           (long)(int)uVar1;
  uVar20 = 1;
  local_e8 = 1;
  if (opt->use_packing_layout == true) {
    uVar20 = 0x10;
    local_e8 = 0x10;
    if ((uVar14 & 0xf) != 0) {
      if ((uVar14 & 7) == 0) {
        local_e8 = 8;
      }
      else {
        local_e8 = (ulong)((uint)((uVar14 & 3) == 0) * 3 + 1);
      }
    }
    if ((uVar1 & 0xf) != 0) {
      if ((uVar1 & 7) == 0) {
        uVar20 = 8;
      }
      else {
        uVar20 = (ulong)((uint)((uVar1 & 3) == 0) * 3 + 1);
      }
    }
  }
  _h = (int)uVar14;
  local_80 = uVar20;
  local_70 = uVar10;
  local_68 = opt;
  if (opt->use_sgemm_convolution == true) {
    pLVar5 = create_layer(0x4a);
    this->gemm = pLVar5;
    ParamDict::ParamDict(&local_e0);
    uVar10 = local_80;
    ParamDict::set(&local_e0,2,1);
    ParamDict::set(&local_e0,3,0);
    ParamDict::set(&local_e0,4,1);
    ParamDict::set(&local_e0,5,0);
    ParamDict::set(&local_e0,6,1);
    ParamDict::set(&local_e0,7,
                   *(int *)(&this->field_0xd0 + (long)this->_vptr_Deconvolution_x86_avx512[-3]) * _w
                  );
    ParamDict::set(&local_e0,8,0);
    ParamDict::set(&local_e0,9,_h);
    ParamDict::set(&local_e0,10,-1);
    ParamDict::set(&local_e0,0xb,0);
    ParamDict::set(&local_e0,0xc,(int)uVar10);
    (*this->gemm->_vptr_Layer[2])(this->gemm,&local_e0);
    local_138.cstep = 0;
    local_138.data = (Allocator *)0x0;
    local_138.refcount._0_4_ = 0;
    local_138.refcount._4_4_ = 0;
    local_138.elemsize._0_4_ = 0;
    local_138.elempack = 0;
    local_138._48_8_ = SUB168(ZEXT816(0) << 0x40,4);
    local_138.elemsize._4_4_ = (int)local_138.refcount;
    local_138.allocator = (Allocator *)local_138.data;
    local_138.dims = (int)local_138.refcount;
    local_138.w = local_138.refcount._4_4_;
    local_138.c = local_138.elempack;
    Mat::reshape(&local_c8,
                 (Mat *)(&this->field_0x160 + (long)this->_vptr_Deconvolution_x86_avx512[-3]),_w,_h,
                 *(int *)&((Mat *)(&this->field_0x160 +
                                  (long)this->_vptr_Deconvolution_x86_avx512[-3]))[-2].data,
                 (Allocator *)0x0);
    Mat::create(&local_138,
                *(int *)(&this->field_0xd0 + (long)this->_vptr_Deconvolution_x86_avx512[-3]) * _w,_h
                ,4,(Allocator *)0x0);
    pOVar9 = local_68;
    if (0 < _h) {
      local_78 = (Allocator *)local_138.data;
      local_d0 = (long)local_138.w *
                 CONCAT44(local_138.elemsize._4_4_,(undefined4)local_138.elemsize);
      pp_Var3 = this->_vptr_Deconvolution_x86_avx512;
      uVar11 = uVar10 & 0xffffffff;
      uVar17 = 0;
      uVar20 = uVar10;
      do {
        if ((int)uVar20 <= *(int *)(&this->field_0xd0 + (long)pp_Var3[-3])) {
          ppp_Var6 = (_func_int ***)
                     ((long)(_func_int ***)local_c8.data +
                     CONCAT44(local_c8.elemsize._4_4_,(undefined4)local_c8.elemsize) * uVar17 *
                     (long)local_c8.w);
          lVar22 = CONCAT44(local_c8.elemsize._4_4_,(undefined4)local_c8.elemsize) * local_c8.cstep;
          ppp_Var18 = (_func_int ***)((long)(_func_int ***)local_138.data + local_d0 * uVar17);
          lVar21 = 0;
          do {
            if (0 < (int)local_70) {
              uVar7 = 0;
              uVar20 = uVar11;
              ppp_Var16 = ppp_Var6;
              ppp_Var13 = ppp_Var6;
              do {
                do {
                  *(undefined4 *)ppp_Var18 = *(undefined4 *)ppp_Var16;
                  ppp_Var18 = (_func_int ***)((long)ppp_Var18 + 4);
                  uVar20 = uVar20 - 1;
                  ppp_Var16 = (_func_int ***)((long)ppp_Var16 + lVar22);
                } while (uVar20 != 0);
                uVar7 = uVar7 + 1;
                ppp_Var16 = (_func_int ***)((long)ppp_Var13 + 4);
                uVar20 = uVar11;
                ppp_Var13 = ppp_Var16;
              } while (uVar7 != (local_70 & 0xffffffff));
            }
            lVar21 = lVar21 + uVar11;
            ppp_Var6 = (_func_int ***)((long)ppp_Var6 + lVar22 * uVar11);
          } while ((long)((ulong)((int)uVar10 - 1) + lVar21) <
                   (long)*(int *)(&this->field_0xd0 + (long)pp_Var3[-3]));
        }
        uVar17 = uVar17 + 1;
        uVar20 = local_80;
      } while (uVar17 != (uVar14 & 0xffffffff));
    }
    piVar4 = (int *)CONCAT44(local_c8.refcount._4_4_,(int)local_c8.refcount);
    if (piVar4 != (int *)0x0) {
      LOCK();
      *piVar4 = *piVar4 + -1;
      UNLOCK();
      if (*piVar4 == 0) {
        if (local_c8.allocator == (Allocator *)0x0) {
          if ((Allocator *)local_c8.data != (Allocator *)0x0) {
            free(local_c8.data);
          }
        }
        else {
          (*(local_c8.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    piVar4 = (int *)CONCAT44(local_138.refcount._4_4_,(int)local_138.refcount);
    if (piVar4 != (int *)0x0) {
      LOCK();
      *piVar4 = *piVar4 + 1;
      UNLOCK();
    }
    local_c8.data = local_138.data;
    local_c8.refcount._0_4_ = (int)local_138.refcount;
    local_c8.refcount._4_4_ = local_138.refcount._4_4_;
    local_c8.elemsize._0_4_ = (undefined4)local_138.elemsize;
    local_c8.elemsize._4_4_ = local_138.elemsize._4_4_;
    local_c8.elempack = local_138.elempack;
    local_c8.allocator = local_138.allocator;
    local_c8.dims = local_138.dims;
    local_c8.w = local_138.w;
    local_c8.h = local_138.h;
    local_c8.d = local_138.d;
    local_c8.c = local_138.c;
    local_c8.cstep = local_138.cstep;
    pLVar5 = this->gemm;
    ModelBinFromMatArray::ModelBinFromMatArray(&local_40,&local_c8);
    (*pLVar5->_vptr_Layer[3])(pLVar5,&local_40);
    ModelBinFromMatArray::~ModelBinFromMatArray(&local_40);
    (*this->gemm->_vptr_Layer[4])(this->gemm,pOVar9);
    piVar4 = (int *)CONCAT44(local_c8.refcount._4_4_,(int)local_c8.refcount);
    if (piVar4 != (int *)0x0) {
      LOCK();
      *piVar4 = *piVar4 + -1;
      UNLOCK();
      if (*piVar4 == 0) {
        if (local_c8.allocator == (Allocator *)0x0) {
          if ((Allocator *)local_c8.data != (Allocator *)0x0) {
            free(local_c8.data);
          }
        }
        else {
          (*(local_c8.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    piVar4 = (int *)CONCAT44(local_138.refcount._4_4_,(int)local_138.refcount);
    if (piVar4 != (int *)0x0) {
      LOCK();
      *piVar4 = *piVar4 + -1;
      UNLOCK();
      if (*piVar4 == 0) {
        if (local_138.allocator == (Allocator *)0x0) {
          if ((Allocator *)local_138.data != (Allocator *)0x0) {
            free(local_138.data);
          }
        }
        else {
          (*(local_138.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    local_138.cstep = 0;
    local_138.data = (void *)0x0;
    local_138.refcount._0_4_ = 0;
    local_138.refcount._4_4_ = 0;
    local_138.elemsize._0_4_ = 0;
    local_138.elemsize._4_4_ = 0;
    local_138.elempack = 0;
    local_138.dims = 0;
    local_138.w = 0;
    local_138.h = 0;
    local_138.d = 0;
    local_138.c = 0;
    ParamDict::~ParamDict(&local_e0);
  }
  else {
    local_138.cstep = 0;
    local_138.data = (Allocator *)0x0;
    local_138.refcount._0_4_ = 0;
    local_138.refcount._4_4_ = 0;
    local_138.elemsize._0_4_ = 0;
    local_138.elempack = 0;
    local_138._48_8_ = SUB168(ZEXT816(0) << 0x40,4);
    iVar19 = 0;
    local_138.elemsize._4_4_ = (int)local_138.refcount;
    local_138.allocator = (Allocator *)local_138.data;
    local_138.dims = (int)local_138.refcount;
    local_138.w = local_138.refcount._4_4_;
    local_138.c = local_138.elempack;
    Mat::create(&local_138,
                *(int *)(&this->field_0x18c + (long)this->_vptr_Deconvolution_x86_avx512[-3]),4,
                (Allocator *)0x0);
    pp_Var3 = this->_vptr_Deconvolution_x86_avx512;
    if (0 < *(int *)(&this->field_0xd0 + (long)pp_Var3[-3]) * _h) {
      lVar21 = *(long *)(&this->field_0x160 + (long)pp_Var3[-3]);
      puVar8 = (undefined4 *)((long)local_138.data + uVar10 * 4 + -4);
      do {
        if (0 < _w) {
          uVar14 = 0;
          puVar12 = puVar8;
          do {
            *puVar12 = *(undefined4 *)(lVar21 + uVar14 * 4);
            uVar14 = uVar14 + 1;
            puVar12 = puVar12 + -1;
          } while ((uVar10 & 0xffffffff) != uVar14);
        }
        iVar19 = iVar19 + 1;
        lVar21 = lVar21 + uVar10 * 4;
        puVar8 = puVar8 + uVar10;
      } while (iVar19 < *(int *)(&this->field_0xd0 + (long)pp_Var3[-3]) * _h);
    }
    Mat::reshape(&local_c8,&local_138,_w,_h,*(int *)(&this->field_0xd0 + (long)pp_Var3[-3]),
                 (Allocator *)0x0);
    iVar19 = (int)uVar20;
    uVar14 = local_e8 & 0xffffffff;
    Mat::create(&this->weight_data_tm,_w,_h / (int)local_e8,
                *(int *)(&this->field_0xd0 + (long)this->_vptr_Deconvolution_x86_avx512[-3]) /
                iVar19,(uint)(iVar19 * 4) * uVar14,(int)local_e8 * iVar19,(Allocator *)0x0);
    pOVar9 = local_68;
    local_48 = this->_vptr_Deconvolution_x86_avx512;
    if (iVar19 <= *(int *)(&this->field_0xd0 + (long)local_48[-3])) {
      local_50 = (ulong)((int)local_80 - 1);
      local_58 = (this->weight_data_tm).data;
      local_60 = (this->weight_data_tm).cstep * (this->weight_data_tm).elemsize;
      local_78 = (Allocator *)((long)_h - (ulong)((int)local_e8 - 1));
      uVar20 = local_80 & 0xffffffff;
      local_d0 = 0;
      do {
        if ((int)local_e8 <= _h) {
          puVar8 = (undefined4 *)
                   (((local_d0 & 0xffffffff) / (local_80 & 0xffffffff)) * local_60 + (long)local_58)
          ;
          lVar15 = local_c8.cstep * CONCAT44(local_c8.elemsize._4_4_,(undefined4)local_c8.elemsize);
          ppp_Var18 = (_func_int ***)((long)(_func_int ***)local_c8.data + lVar15 * local_d0);
          lVar21 = (long)local_c8.w *
                   CONCAT44(local_c8.elemsize._4_4_,(undefined4)local_c8.elemsize);
          lVar22 = 0;
          do {
            if (0 < (int)local_70) {
              uVar11 = 0;
              ppp_Var6 = ppp_Var18;
              do {
                uVar7 = 0;
                ppp_Var16 = ppp_Var6;
                uVar17 = uVar20;
                ppp_Var13 = ppp_Var6;
                do {
                  do {
                    *puVar8 = *(undefined4 *)ppp_Var16;
                    puVar8 = puVar8 + 1;
                    uVar17 = uVar17 - 1;
                    ppp_Var16 = (_func_int ***)((long)ppp_Var16 + lVar15);
                  } while (uVar17 != 0);
                  uVar7 = uVar7 + 1;
                  ppp_Var16 = (_func_int ***)((long)ppp_Var13 + lVar21);
                  uVar17 = uVar20;
                  ppp_Var13 = ppp_Var16;
                } while (uVar7 != uVar14);
                uVar11 = uVar11 + 1;
                ppp_Var6 = (_func_int ***)((long)ppp_Var6 + 4);
              } while (uVar11 != (uVar10 & 0xffffffff));
            }
            lVar22 = lVar22 + uVar14;
            ppp_Var18 = (_func_int ***)((long)ppp_Var18 + lVar21 * uVar14);
          } while (lVar22 < (long)local_78);
        }
        local_d0 = local_d0 + uVar20;
      } while ((long)(local_50 + local_d0) < (long)*(int *)(&this->field_0xd0 + (long)local_48[-3]))
      ;
    }
    piVar4 = (int *)CONCAT44(local_c8.refcount._4_4_,(int)local_c8.refcount);
    if (piVar4 != (int *)0x0) {
      LOCK();
      *piVar4 = *piVar4 + -1;
      UNLOCK();
      if (*piVar4 == 0) {
        if (local_c8.allocator == (Allocator *)0x0) {
          if ((Allocator *)local_c8.data != (Allocator *)0x0) {
            free(local_c8.data);
          }
        }
        else {
          (*(local_c8.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    piVar4 = (int *)CONCAT44(local_138.refcount._4_4_,(int)local_138.refcount);
    if (piVar4 != (int *)0x0) {
      LOCK();
      *piVar4 = *piVar4 + -1;
      UNLOCK();
      if (*piVar4 == 0) {
        if (local_138.allocator == (Allocator *)0x0) {
          if ((Allocator *)local_138.data != (Allocator *)0x0) {
            free(local_138.data);
          }
        }
        else {
          (*(local_138.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    local_138.cstep = 0;
    local_138.data = (void *)0x0;
    local_138.refcount._0_4_ = 0;
    local_138.refcount._4_4_ = 0;
    local_138.elemsize._0_4_ = 0;
    local_138.elemsize._4_4_ = 0;
    local_138.elempack = 0;
    local_138.dims = 0;
    local_138.w = 0;
    local_138.h = 0;
    local_138.d = 0;
    local_138.c = 0;
  }
  if (pOVar9->lightmode == true) {
    p_Var2 = this->_vptr_Deconvolution_x86_avx512[-3];
    piVar4 = *(int **)(&this->field_0x168 + (long)p_Var2);
    if (piVar4 != (int *)0x0) {
      LOCK();
      *piVar4 = *piVar4 + -1;
      UNLOCK();
      if (*piVar4 == 0) {
        if (*(long **)(&this->field_0x180 + (long)p_Var2) == (long *)0x0) {
          if (*(void **)(&this->field_0x160 + (long)p_Var2) != (void *)0x0) {
            free(*(void **)(&this->field_0x160 + (long)p_Var2));
          }
        }
        else {
          (**(code **)(**(long **)(&this->field_0x180 + (long)p_Var2) + 0x18))();
        }
      }
    }
    *(undefined8 *)(&this->field_0x1a0 + (long)p_Var2) = 0;
    *(undefined8 *)(&this->field_0x16c + (long)p_Var2) = 0;
    *(undefined8 *)(&this->field_0x174 + (long)p_Var2) = 0;
    *(undefined8 *)(&this->field_0x160 + (long)p_Var2) = 0;
    *(undefined8 *)(&this->field_0x168 + (long)p_Var2) = 0;
    *(undefined8 *)(&this->field_0x188 + (long)p_Var2) = 0;
    *(undefined8 *)(&this->field_0x190 + (long)p_Var2) = 0;
    *(undefined4 *)(&this->field_0x198 + (long)p_Var2) = 0;
  }
  return 0;
}

Assistant:

int Deconvolution_x86_avx512::create_pipeline(const Option& opt)
{
    activation = create_activation_layer(activation_type, activation_params, opt);

    const int maxk = kernel_w * kernel_h;
    int num_input = weight_data_size / maxk / num_output;

    int elempack = 1;
    int out_elempack = 1;
#if __SSE2__
    if (opt.use_packing_layout)
    {
#if __AVX512F__
        elempack = num_input % 16 == 0 ? 16 : num_input % 8 == 0 ? 8 : num_input % 4 == 0 ? 4 : 1;
        out_elempack = num_output % 16 == 0 ? 16 : num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#elif __AVX__
        elempack = num_input % 8 == 0 ? 8 : num_input % 4 == 0 ? 4 : 1;
        out_elempack = num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#else
        elempack = num_input % 4 == 0 ? 4 : 1;
        out_elempack = num_output % 4 == 0 ? 4 : 1;
#endif
    }
#endif // __SSE2__

    if (opt.use_sgemm_convolution)
    {
        const int maxk = kernel_w * kernel_h;

        gemm = ncnn::create_layer(ncnn::LayerType::Gemm);

        ncnn::ParamDict pd;
        pd.set(2, 1);                 // transA
        pd.set(3, 0);                 // transB
        pd.set(4, 1);                 // constantA
        pd.set(5, 0);                 // constantB
        pd.set(6, 1);                 // constantC
        pd.set(7, maxk * num_output); // M = maxk*num_output
        pd.set(8, 0);                 // N = size
        pd.set(9, num_input);         // K = inch
        pd.set(10, -1);               // constant_broadcast_type_C = null
        pd.set(11, 0);                // output_N1M
        pd.set(12, out_elempack);

        gemm->load_param(pd);

        // maxk-inch-outch to pa-maxk-outch/pa-inch
        Mat tmp;
        {
            Mat weight_data_r2 = weight_data.reshape(maxk, num_input, num_output);

            tmp.create(maxk * num_output, num_input);

            for (int p = 0; p < num_input; p += 1)
            {
                float* g00 = tmp.row(p);

                for (int q = 0; q + (out_elempack - 1) < num_output; q += out_elempack)
                {
                    for (int k = 0; k < maxk; k++)
                    {
                        for (int i = 0; i < out_elempack; i++)
                        {
                            const float* k00 = weight_data_r2.channel(q + i).row(p);
                            g00[0] = k00[k];
                            g00++;
                        }
                    }
                }
            }
        }

        ncnn::Mat weights[1];
        weights[0] = tmp;

        gemm->load_model(ModelBinFromMatArray(weights));

        gemm->create_pipeline(opt);
    }
    else
    {
        Mat weight_data_transposed(weight_data.w);
        {
            float* pt = weight_data_transposed;
            const float* p = weight_data;

            for (int i = 0; i < num_input * num_output; i++)
            {
                for (int k = 0; k < maxk; k++)
                {
                    pt[maxk - 1 - k] = p[k];
                }

                p += maxk;
                pt += maxk;
            }
        }

        // src = kw-kh-inch-outch
        // dst = pb-pa-kw-kh-inch/pa-outch/pb
        Mat weight_data_r2 = weight_data_transposed.reshape(maxk, num_input, num_output);

        weight_data_tm.create(maxk, num_input / elempack, num_output / out_elempack, (size_t)4u * elempack * out_elempack, elempack * out_elempack);

        for (int q = 0; q + (out_elempack - 1) < num_output; q += out_elempack)
        {
            float* g00 = weight_data_tm.channel(q / out_elempack);

            for (int p = 0; p + (elempack - 1) < num_input; p += elempack)
            {
                for (int k = 0; k < maxk; k++)
                {
                    for (int i = 0; i < elempack; i++)
                    {
                        for (int j = 0; j < out_elempack; j++)
                        {
                            const float* k00 = weight_data_r2.channel(q + j).row(p + i);

                            g00[0] = k00[k];

                            g00++;
                        }
                    }
                }
            }
        }
    }

    if (opt.lightmode)
    {
        weight_data.release();
    }

    return 0;
}